

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBooleanStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::BooleanStateQueryVerifiers::GetFloatVerifier::verifyBoolean4
          (GetFloatVerifier *this,TestContext *testCtx,GLenum name,bool reference0,bool reference1,
          bool reference2,bool reference3)

{
  ostringstream *this_00;
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  StateQueryMemoryWriteGuard<float[4]> boolVector4;
  StateQueryMemoryWriteGuard<float[4]> local_1d8;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  local_1d8.m_postguard[0] = -8.0297587e+18;
  local_1d8.m_postguard[1] = -8.0297587e+18;
  local_1d8.m_postguard[2] = -8.0297587e+18;
  local_1d8.m_postguard[3] = -8.0297587e+18;
  local_1d8.m_value[0] = -8.0297587e+18;
  local_1d8.m_value[1] = -8.0297587e+18;
  local_1d8.m_value[2] = -8.0297587e+18;
  local_1d8.m_value[3] = -8.0297587e+18;
  local_1d8.m_preguard[0] = -8.0297587e+18;
  local_1d8.m_preguard[1] = -8.0297587e+18;
  local_1d8.m_preguard[2] = -8.0297587e+18;
  local_1d8.m_preguard[3] = -8.0297587e+18;
  glu::CallLogWrapper::glGetFloatv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,local_1d8.m_value);
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::verifyValidity
                    (&local_1d8,testCtx);
  if (bVar2) {
    fVar4 = (float)((int)((uint)reference0 << 0x1f) >> 0x1f & 0x3f800000);
    fVar5 = (float)((int)((uint)reference1 << 0x1f) >> 0x1f & 0x3f800000);
    fVar6 = (float)((int)((uint)reference2 << 0x1f) >> 0x1f & 0x3f800000);
    fVar7 = (float)((int)((uint)reference3 << 0x1f) >> 0x1f & 0x3f800000);
    auVar1._4_4_ = -(uint)(local_1d8.m_value[1] != fVar5);
    auVar1._0_4_ = -(uint)(local_1d8.m_value[0] != fVar4);
    auVar1._8_4_ = -(uint)(local_1d8.m_value[2] != fVar6);
    auVar1._12_4_ = -(uint)(local_1d8.m_value[3] != fVar7);
    iVar3 = movmskps((uint)reference3,auVar1);
    if (iVar3 != 0) {
      local_1a0._0_8_ = testCtx->m_log;
      this_00 = (ostringstream *)(local_1a0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"// ERROR: expected ",0x13);
      std::ostream::_M_insert<double>((double)fVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      std::ostream::_M_insert<double>((double)fVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      std::ostream::_M_insert<double>((double)fVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      std::ostream::_M_insert<double>((double)fVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_128);
      if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid float value");
      }
    }
  }
  return;
}

Assistant:

void GetFloatVerifier::verifyBoolean4 (tcu::TestContext& testCtx, GLenum name, bool reference0, bool reference1, bool reference2, bool reference3)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat[4]> boolVector4;
	glGetFloatv(name, boolVector4);

	if (!boolVector4.verifyValidity(testCtx))
		return;

	const GLfloat referenceAsGLfloat[] =
	{
		reference0 ? 1.0f : 0.0f,
		reference1 ? 1.0f : 0.0f,
		reference2 ? 1.0f : 0.0f,
		reference3 ? 1.0f : 0.0f,
	};

	if (boolVector4[0] != referenceAsGLfloat[0] ||
		boolVector4[1] != referenceAsGLfloat[1] ||
		boolVector4[2] != referenceAsGLfloat[2] ||
		boolVector4[3] != referenceAsGLfloat[3])
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected "
			<< referenceAsGLfloat[0] << " "
			<< referenceAsGLfloat[1] << " "
			<< referenceAsGLfloat[2] << " "
			<< referenceAsGLfloat[3] << " " << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid float value");
	}
}